

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msbuild_objectmodel.cpp
# Opt level: O2

bool VCXProjectWriter::outputFileConfig
               (OutputFilterData *d,XmlOutput *xml,XmlOutput *xmlFilter,QString *filename,
               QString *fullFilterName,bool fileAdded,bool hasCustomBuildStep)

{
  QArrayDataPointer<char16_t> *this;
  bool bVar1;
  VCProjectWriter *pVVar2;
  QString str;
  char cVar3;
  byte bVar4;
  XmlOutput *pXVar5;
  xml_output *pxVar6;
  long in_FS_OFFSET;
  undefined8 in_stack_fffffffffffffe88;
  QArrayDataPointer<char16_t> local_160;
  xml_output local_148;
  QArrayDataPointer<char16_t> local_110;
  undefined1 local_f8 [80];
  QArrayDataPointer<char16_t> local_a8;
  xml_output local_88;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (d->inBuild == true) {
    if (((d->filter).Project)->usePCH == true) {
      local_50.d = (filename->d).d;
      local_50.ptr = (filename->d).ptr;
      local_50.size = (filename->d).size;
      if (local_50.d != (Data *)0x0) {
        LOCK();
        ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      str.d.ptr = (char16_t *)xml;
      str.d.d = (Data *)in_stack_fffffffffffffe88;
      str.d.size = (qsizetype)xmlFilter;
      VCFilter::modifyPCHstage(&d->filter,str);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    }
  }
  else if ((d->info).excludeFromBuild == true) {
    (d->filter).useCompilerTool = true;
  }
  if (hasCustomBuildStep) {
LAB_001aa2cd:
    if (!fileAdded) {
      QString::QString((QString *)&local_a8,"CustomBuild");
      tag(&local_88,(QString *)&local_a8);
      pXVar5 = XmlOutput::operator<<(xmlFilter,&local_88);
      QString::QString((QString *)local_f8,"Include");
      Option::fixPathToTargetOS((QString *)&local_110,filename,true,true);
      pxVar6 = (xml_output *)(local_f8 + 0x18);
      attributeTag(pxVar6,(QString *)local_f8,(QString *)&local_110);
      pXVar5 = XmlOutput::operator<<(pXVar5,pxVar6);
      attrTagS(&local_148,"Filter",fullFilterName);
      XmlOutput::operator<<(pXVar5,&local_148);
      XmlOutput::xml_output::~xml_output(&local_148);
      XmlOutput::xml_output::~xml_output(pxVar6);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_110);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_f8);
      XmlOutput::xml_output::~xml_output(&local_88);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
      QString::QString((QString *)&local_148,"CustomBuild");
      tag(&local_88,(QString *)&local_148);
      pXVar5 = XmlOutput::operator<<(xml,&local_88);
      QString::QString((QString *)&local_a8,"Include");
      Option::fixPathToTargetOS((QString *)local_f8,filename,true,true);
      pxVar6 = (xml_output *)(local_f8 + 0x18);
      attributeTag(pxVar6,(QString *)&local_a8,(QString *)local_f8);
      XmlOutput::operator<<(pXVar5,pxVar6);
      XmlOutput::xml_output::~xml_output(pxVar6);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_f8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
      XmlOutput::xml_output::~xml_output(&local_88);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_148);
      QString::QString((QString *)&local_88,"Form Files");
      cVar3 = QString::startsWith((QString *)d,(CaseSensitivity)&local_88);
      if (cVar3 == '\0') {
        QString::QString((QString *)(local_f8 + 0x18),"Generated Files");
        cVar3 = QString::startsWith((QString *)d,(CaseSensitivity)(QString *)(local_f8 + 0x18));
        if (cVar3 != '\0') {
LAB_001aa4fd:
          QArrayDataPointer<char16_t>::~QArrayDataPointer
                    ((QArrayDataPointer<char16_t> *)(local_f8 + 0x18));
          goto LAB_001aa50a;
        }
        QString::QString((QString *)&local_148,"Resource Files");
        cVar3 = QString::startsWith((QString *)d,(CaseSensitivity)&local_148);
        if (cVar3 != '\0') {
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_148)
          ;
          goto LAB_001aa4fd;
        }
        QString::QString((QString *)&local_a8,"Deployment Files");
        cVar3 = QString::startsWith((QString *)d,(CaseSensitivity)&local_a8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_148);
        QArrayDataPointer<char16_t>::~QArrayDataPointer
                  ((QArrayDataPointer<char16_t> *)(local_f8 + 0x18));
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
        if (cVar3 == '\0') goto LAB_001aa565;
      }
      else {
LAB_001aa50a:
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
      }
      this = (QArrayDataPointer<char16_t> *)(local_f8 + 0x18);
      QString::QString((QString *)this,"Document");
      attrTagS(&local_88,"FileType",(QString *)this);
      XmlOutput::operator<<(xml,&local_88);
      XmlOutput::xml_output::~xml_output(&local_88);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(this);
    }
LAB_001aa565:
    pVVar2 = ((d->filter).Project)->projectWriter;
    (*pVVar2->_vptr_VCProjectWriter[8])(pVVar2,xml,&(d->filter).CustomBuildTool);
  }
  else {
    bVar4 = (d->filter).useCustomBuildTool;
    if ((((bool)bVar4 == false) && ((d->filter).useCompilerTool == false)) && (d->inBuild == true))
    {
      QString::QString((QString *)&local_88,"Deployment Files");
      cVar3 = QString::startsWith((QString *)d,(CaseSensitivity)&local_88);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
      if (cVar3 == '\0') goto LAB_001aaa8a;
      bVar4 = (d->filter).useCustomBuildTool;
    }
    if ((bVar4 & 1) != 0) goto LAB_001aa2cd;
    if (!fileAdded) {
      outputFileConfig(xml,xmlFilter,filename,fullFilterName);
    }
  }
  local_a8.size = -0x5555555555555556;
  local_a8.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_a8.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  generateCondition((QString *)&local_a8,(d->filter).Config);
  if (d->inBuild == false) {
    QString::QString((QString *)local_f8,"ExcludedFromBuild");
    tag(&local_88,(QString *)local_f8);
    pXVar5 = XmlOutput::operator<<(xml,&local_88);
    QString::QString((QString *)&local_110,"Condition");
    pxVar6 = (xml_output *)(local_f8 + 0x18);
    attributeTag(pxVar6,(QString *)&local_110,(QString *)&local_a8);
    pXVar5 = XmlOutput::operator<<(pXVar5,pxVar6);
    QString::QString((QString *)&local_160,"true");
    valueTag(&local_148,(QString *)&local_160);
    XmlOutput::operator<<(pXVar5,&local_148);
    XmlOutput::xml_output::~xml_output(&local_148);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_160);
    XmlOutput::xml_output::~xml_output(pxVar6);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_110);
    XmlOutput::xml_output::~xml_output(&local_88);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_f8);
  }
  QString::QString((QString *)&local_88,"Deployment Files");
  cVar3 = QString::startsWith((QString *)d,(CaseSensitivity)&local_88);
  if (cVar3 == '\0') {
    pxVar6 = &local_88;
LAB_001aa7c8:
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)pxVar6);
  }
  else {
    bVar1 = d->inBuild;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
    if (bVar1 == true) {
      QString::QString((QString *)local_f8,"DeploymentContent");
      tag(&local_88,(QString *)local_f8);
      pXVar5 = XmlOutput::operator<<(xml,&local_88);
      QString::QString((QString *)&local_110,"Condition");
      pxVar6 = (xml_output *)(local_f8 + 0x18);
      attributeTag(pxVar6,(QString *)&local_110,(QString *)&local_a8);
      pXVar5 = XmlOutput::operator<<(pXVar5,pxVar6);
      QString::QString((QString *)&local_160,"true");
      valueTag(&local_148,(QString *)&local_160);
      XmlOutput::operator<<(pXVar5,&local_148);
      XmlOutput::xml_output::~xml_output(&local_148);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_160);
      XmlOutput::xml_output::~xml_output(pxVar6);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_110);
      XmlOutput::xml_output::~xml_output(&local_88);
      pxVar6 = (xml_output *)local_f8;
      goto LAB_001aa7c8;
    }
  }
  if ((d->filter).useCompilerTool == true) {
    if ((d->filter).CompilerTool.ForcedIncludeFiles.d.size != 0) {
      QString::QString((QString *)local_f8,"ForcedIncludeFiles");
      tag(&local_88,(QString *)local_f8);
      pXVar5 = XmlOutput::operator<<(xml,&local_88);
      QString::QString((QString *)&local_110,"Condition");
      pxVar6 = (xml_output *)(local_f8 + 0x18);
      attributeTag(pxVar6,(QString *)&local_110,(QString *)&local_a8);
      pXVar5 = XmlOutput::operator<<(pXVar5,pxVar6);
      valueTagX(&local_148,&(d->filter).CompilerTool.ForcedIncludeFiles," ");
      XmlOutput::operator<<(pXVar5,&local_148);
      XmlOutput::xml_output::~xml_output(&local_148);
      XmlOutput::xml_output::~xml_output(pxVar6);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_110);
      XmlOutput::xml_output::~xml_output(&local_88);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_f8);
    }
    if ((d->filter).CompilerTool.PrecompiledHeaderThrough.d.size != 0) {
      QString::QString((QString *)local_f8,"PrecompiledHeaderFile");
      tag(&local_88,(QString *)local_f8);
      pXVar5 = XmlOutput::operator<<(xml,&local_88);
      QString::QString((QString *)&local_110,"Condition");
      pxVar6 = (xml_output *)(local_f8 + 0x18);
      attributeTag(pxVar6,(QString *)&local_110,(QString *)&local_a8);
      pXVar5 = XmlOutput::operator<<(pXVar5,pxVar6);
      valueTag(&local_148,&(d->filter).CompilerTool.PrecompiledHeaderThrough);
      XmlOutput::operator<<(pXVar5,&local_148);
      XmlOutput::xml_output::~xml_output(&local_148);
      XmlOutput::xml_output::~xml_output(pxVar6);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_110);
      XmlOutput::xml_output::~xml_output(&local_88);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_f8);
    }
    if ((d->filter).CompilerTool.UsePrecompiledHeader != pchUnset) {
      QString::QString((QString *)local_f8,"PrecompiledHeader");
      tag(&local_88,(QString *)local_f8);
      pXVar5 = XmlOutput::operator<<(xml,&local_88);
      QString::QString((QString *)&local_110,"Condition");
      pxVar6 = (xml_output *)(local_f8 + 0x18);
      attributeTag(pxVar6,(QString *)&local_110,(QString *)&local_a8);
      pXVar5 = XmlOutput::operator<<(pXVar5,pxVar6);
      toString((QString *)&local_160,(d->filter).CompilerTool.UsePrecompiledHeader);
      valueTag(&local_148,(QString *)&local_160);
      XmlOutput::operator<<(pXVar5,&local_148);
      XmlOutput::xml_output::~xml_output(&local_148);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_160);
      XmlOutput::xml_output::~xml_output(pxVar6);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_110);
      XmlOutput::xml_output::~xml_output(&local_88);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_f8);
    }
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
  fileAdded = true;
LAB_001aaa8a:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return fileAdded;
}

Assistant:

bool VCXProjectWriter::outputFileConfig(OutputFilterData *d, XmlOutput &xml, XmlOutput &xmlFilter,
                                        const QString &filename, const QString &fullFilterName,
                                        bool fileAdded, bool hasCustomBuildStep)
{
    VCFilter &filter = d->filter;
    if (d->inBuild) {
        if (filter.Project->usePCH)
            filter.modifyPCHstage(filename);
    } else {
        // Excluded files uses an empty compiler stage
        if (d->info.excludeFromBuild)
            filter.useCompilerTool = true;
    }

    // Actual XML output ----------------------------------
    if (hasCustomBuildStep || filter.useCustomBuildTool || filter.useCompilerTool
            || !d->inBuild || filter.Name.startsWith("Deployment Files")) {

        if (hasCustomBuildStep || filter.useCustomBuildTool)
        {
            if (!fileAdded) {
                fileAdded = true;

                xmlFilter << tag("CustomBuild")
                    << attrTag("Include", Option::fixPathToTargetOS(filename))
                    << attrTagS("Filter", fullFilterName);

                xml << tag("CustomBuild")
                    << attrTag("Include", Option::fixPathToTargetOS(filename));

                if (filter.Name.startsWith("Form Files")
                        || filter.Name.startsWith("Generated Files")
                        || filter.Name.startsWith("Resource Files")
                        || filter.Name.startsWith("Deployment Files"))
                    xml << attrTagS("FileType", "Document");
            }

            filter.Project->projectWriter->write(xml, filter.CustomBuildTool);
        }

        if (!fileAdded)
        {
            fileAdded = true;
            outputFileConfig(xml, xmlFilter, filename, fullFilterName);
        }

        const QString condition = generateCondition(*filter.Config);
        if (!d->inBuild) {
            xml << tag("ExcludedFromBuild")
                << attrTag("Condition", condition)
                << valueTag("true");
        }

        if (filter.Name.startsWith("Deployment Files") && d->inBuild) {
            xml << tag("DeploymentContent")
                << attrTag("Condition", condition)
                << valueTag("true");
        }

        if (filter.useCompilerTool) {

            if ( !filter.CompilerTool.ForcedIncludeFiles.isEmpty() ) {
                xml << tag("ForcedIncludeFiles")
                    << attrTag("Condition", condition)
                    << valueTagX(filter.CompilerTool.ForcedIncludeFiles);
            }

            if ( !filter.CompilerTool.PrecompiledHeaderThrough.isEmpty() ) {
                xml << tag("PrecompiledHeaderFile")
                    << attrTag("Condition", condition)
                    << valueTag(filter.CompilerTool.PrecompiledHeaderThrough);
            }

            if (filter.CompilerTool.UsePrecompiledHeader != pchUnset) {
                xml << tag("PrecompiledHeader")
                    << attrTag("Condition", condition)
                    << valueTag(toString(filter.CompilerTool.UsePrecompiledHeader));
            }
        }
    }

    return fileAdded;
}